

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_gather.c
# Opt level: O3

REF_STATUS ref_gather_by_extension(REF_GRID ref_grid,char *filename)

{
  char *pcVar1;
  int *piVar2;
  REF_NODE pRVar3;
  REF_CELL pRVar4;
  REF_INT *pRVar5;
  REF_DBL *pRVar6;
  REF_SIZE RVar7;
  REF_MPI ref_mpi;
  int iVar8;
  uint uVar9;
  REF_STATUS RVar10;
  size_t sVar11;
  FILE *pFVar12;
  size_t sVar13;
  long lVar14;
  void *pvVar15;
  void *pvVar16;
  uint *puVar17;
  int iVar18;
  uint uVar19;
  REF_INT RVar20;
  undefined8 uVar21;
  REF_GLOB RVar22;
  int iVar23;
  long lVar24;
  ulong uVar25;
  REF_GEOM pRVar26;
  char *pcVar27;
  long lVar28;
  size_t next_position;
  long lVar29;
  ulong uVar30;
  bool bVar31;
  int length;
  char nul;
  char ref_point_desc [1];
  REF_LONG ntri;
  char mesh_name [16];
  REF_LONG ntet;
  char coordinate_system [7];
  REF_INT max_faceid;
  char mesh_units [12];
  REF_INT min_faceid;
  REF_GLOB *l2c;
  REF_LONG nedg;
  REF_GLOB nnode;
  char file_description [7];
  int refined;
  int precision;
  int n_meshes;
  int revision_number;
  int magic_number;
  char mesh_generator [7];
  char magic_string [7];
  char *patch_type;
  char *patch_label;
  char contact_info [12];
  char element_scheme [8];
  double model_scale;
  char mesh_type [8];
  int dimension;
  REF_INT RVar32;
  REF_BOOL in_stack_fffffffffffffe58;
  int in_stack_fffffffffffffe60;
  uint in_stack_fffffffffffffe64;
  uint local_18c;
  FILE *local_188;
  uint local_180;
  char local_179;
  REF_MPI local_178;
  uint local_170 [2];
  ulong local_168;
  char acStack_160 [8];
  void *local_158;
  REF_GEOM local_150;
  uint local_148 [3];
  undefined4 local_13c;
  undefined3 uStack_138;
  int local_134;
  size_t local_130;
  undefined4 local_124;
  ulong local_118;
  uint local_10c;
  REF_GLOB *local_108;
  undefined6 uStack_100;
  undefined2 uStack_fa;
  undefined6 uStack_f8;
  uint local_e8 [2];
  ulong local_e0;
  REF_DBL *local_d8 [5];
  undefined4 local_b0;
  undefined3 uStack_ac;
  void *local_a8;
  undefined4 local_9c;
  undefined4 local_98;
  undefined4 local_94;
  undefined4 local_90;
  undefined4 local_8c;
  undefined4 local_88;
  undefined3 uStack_84;
  undefined4 local_80;
  undefined3 uStack_7c;
  void *local_78;
  char *local_70;
  char *local_68;
  undefined8 local_60;
  undefined4 local_58;
  undefined8 local_50;
  undefined8 local_48;
  undefined8 local_40;
  int local_34;
  
  sVar11 = strlen(filename);
  if (sVar11 < 5) goto LAB_00132844;
  pcVar27 = filename + (sVar11 - 4);
  iVar8 = strcmp(pcVar27,".tec");
  if (((iVar8 != 0) && (iVar8 = strcmp(pcVar27,".dat"), iVar8 != 0)) &&
     ((pcVar1 = filename + sVar11, pcVar1[-2] != '.' || ((pcVar1[-1] != 't' || (*pcVar1 != '\0')))))
     ) {
    iVar8 = strcmp(pcVar27,".avm");
    if (iVar8 != 0) {
      iVar8 = strcmp(pcVar27,".plt");
      if (iVar8 == 0) {
        uVar9 = ref_gather_scalar_by_extension(ref_grid,0,(REF_DBL *)0x0,(char **)0x0,filename);
        if (uVar9 == 0) {
          return 0;
        }
        pcVar27 = "scalar plt";
        uVar21 = 0xb74;
        goto LAB_00132900;
      }
      if (sVar11 < 0xb) {
        if (sVar11 == 10) {
          iVar8 = strcmp(filename + 1,".b8.ugrid");
          if (iVar8 == 0) goto LAB_00132795;
        }
        else if (sVar11 < 7) goto LAB_00132844;
        goto LAB_00132829;
      }
      pcVar27 = pcVar1 + -10;
      iVar8 = strcmp(pcVar27,".lb8.ugrid");
      if (iVar8 == 0) {
        uVar9 = ref_gather_bin_ugrid(ref_grid,filename,0,0);
        if (uVar9 == 0) {
          return 0;
        }
        pcVar27 = ".lb8.ugrid failed";
        uVar21 = 0xb7a;
        goto LAB_00132900;
      }
      iVar8 = strcmp(pcVar1 + -9,".b8.ugrid");
      if (iVar8 == 0) {
LAB_00132795:
        uVar9 = ref_gather_bin_ugrid(ref_grid,filename,1,0);
        if (uVar9 == 0) {
          return 0;
        }
        pcVar27 = ".b8.ugrid failed";
        uVar21 = 0xb80;
LAB_00132900:
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
               uVar21,"ref_gather_by_extension",(ulong)uVar9,pcVar27);
        return uVar9;
      }
      if (sVar11 == 0xb) {
        iVar8 = strcmp(pcVar27,".b8l.ugrid");
        if (iVar8 == 0) {
LAB_00132bc5:
          uVar9 = ref_gather_bin_ugrid(ref_grid,filename,1,1);
          if (uVar9 == 0) {
            return 0;
          }
          pcVar27 = ".b8l.ugrid failed";
          uVar21 = 0xb8c;
          goto LAB_00132679;
        }
      }
      else {
        iVar8 = strcmp(pcVar1 + -0xb,".lb8l.ugrid");
        if (iVar8 == 0) {
          uVar9 = ref_gather_bin_ugrid(ref_grid,filename,0,1);
          if (uVar9 == 0) {
            return 0;
          }
          pcVar27 = ".lb8l.ugrid failed";
          uVar21 = 0xb86;
          goto LAB_00132900;
        }
        iVar8 = strcmp(pcVar27,".b8l.ugrid");
        if (iVar8 == 0) goto LAB_00132bc5;
        if ((0xc < sVar11) && (iVar8 = strcmp(pcVar1 + -0xc,".lb8.ugrid64"), iVar8 == 0)) {
          uVar9 = ref_gather_bin_ugrid(ref_grid,filename,0,1);
          if (uVar9 == 0) {
            return 0;
          }
          pcVar27 = ".lb8.ugrid64 failed";
          uVar21 = 0xb92;
          goto LAB_00132900;
        }
        iVar8 = strcmp(pcVar1 + -0xb,".b8.ugrid64");
        if (iVar8 == 0) {
          uVar9 = ref_gather_bin_ugrid(ref_grid,filename,1,1);
          if (uVar9 == 0) {
            return 0;
          }
          pcVar27 = ".b8.ugrid64 failed";
          uVar21 = 0xb98;
          goto LAB_00132679;
        }
      }
LAB_00132829:
      iVar8 = strcmp(pcVar1 + -6,".meshb");
      if (iVar8 != 0) {
LAB_00132844:
        printf("%s: %d: %s %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
               0xba0,"output file name extension unknown",filename);
        return 1;
      }
      pRVar3 = ref_grid->node;
      pRVar26 = ref_grid->geom;
      uVar9 = ref_node_synchronize_globals(pRVar3);
      if (uVar9 != 0) {
        pcVar27 = "sync";
        uVar21 = 0x8c5;
        goto LAB_00132951;
      }
      local_e8[0] = (ref_grid->twod == 0) + 2;
      local_124 = 2;
      uVar9 = ref_grid->meshb_version;
      if ((int)uVar9 < 2) {
        if (pRVar3->old_n_global < 0x989681) {
          uVar30 = 8;
          local_e0 = 4;
          local_118 = 0;
        }
        else {
          bVar31 = 200000000 < (ulong)pRVar3->old_n_global;
          local_118 = (ulong)bVar31;
          local_124 = bVar31 + 3;
          local_e0 = (ulong)((uint)bVar31 * 4 + 4);
          uVar30 = 0xc;
        }
      }
      else {
        local_118 = (ulong)(3 < uVar9);
        local_e0 = (ulong)((uint)(3 < uVar9) * 4 + 4);
        uVar30 = (ulong)((uint)(uVar9 != 2) * 4 + 8);
        local_124 = uVar9;
      }
      local_178 = (REF_MPI)CONCAT44(local_178._4_4_,(int)local_e0 + (int)uVar30);
      sVar11 = 0;
      pFVar12 = (FILE *)0x0;
      uVar19 = local_124;
      local_150 = pRVar26;
      if (ref_grid->mpi->id != 0) goto LAB_00132f53;
      pFVar12 = fopen(filename,"w");
      if (pFVar12 != (FILE *)0x0) {
        local_60 = CONCAT44(local_60._4_4_,1);
        sVar13 = fwrite(&local_60,4,1,pFVar12);
        if (sVar13 == 1) {
          sVar13 = fwrite(&local_124,4,1,pFVar12);
          if (sVar13 == 1) {
            lVar28 = ftell(pFVar12);
            local_170[0] = 3;
            sVar13 = fwrite(local_170,4,1,pFVar12);
            if (sVar13 == 1) {
              sVar11 = uVar30 + lVar28 + 4;
              local_180 = local_124;
              uVar9 = ref_export_meshb_next_position((FILE *)pFVar12,local_124,sVar11);
              if (uVar9 != 0) {
                pcVar27 = "next p";
                uVar21 = 0x8e7;
                goto LAB_00132951;
              }
              local_188 = pFVar12;
              sVar13 = fwrite(local_e8,4,1,pFVar12);
              if (sVar13 == 1) {
                sVar13 = ftell(local_188);
                pFVar12 = local_188;
                if (sVar11 == sVar13) {
                  uVar19 = local_180;
                  if (ref_grid->mpi->id == 0) {
                    lVar14 = (long)(int)local_e8[0];
                    uVar30 = local_e0 & 0xffffffff;
                    lVar28 = pRVar3->old_n_global;
                    lVar29 = ftell(local_188);
                    local_170[0] = 4;
                    sVar13 = fwrite(local_170,4,1,pFVar12);
                    if (sVar13 != 1) {
                      pcVar27 = "vertex version code";
                      uVar21 = 0x8f2;
                      sVar11 = 1;
                      goto LAB_00134399;
                    }
                    sVar11 = lVar29 + ((ulong)local_178 & 0xffffffff) +
                             (uVar30 + lVar14 * 8) * lVar28;
                    uVar9 = ref_export_meshb_next_position((FILE *)local_188,local_180,sVar11);
                    uVar19 = local_180;
                    pFVar12 = local_188;
                    if (uVar9 != 0) {
                      pcVar27 = "next p";
                      uVar21 = 0x8f3;
                      goto LAB_00132951;
                    }
                    uVar9 = ref_gather_meshb_glob((FILE *)local_188,local_180,pRVar3->old_n_global);
                    if (uVar9 != 0) {
                      pcVar27 = "nnode";
                      uVar21 = 0x8f5;
                      goto LAB_00134da7;
                    }
                  }
LAB_00132f53:
                  local_130 = sVar11;
                  uVar9 = ref_gather_node(pRVar3,0,uVar19,ref_grid->twod,(FILE *)pFVar12);
                  if (uVar9 != 0) {
                    pcVar27 = "nodes";
                    uVar21 = 0x8f9;
                    goto LAB_00132951;
                  }
                  local_180 = uVar19;
                  if ((ref_grid->mpi->id != 0) || (sVar13 = ftell(pFVar12), local_130 == sVar13)) {
                    uVar30 = (ulong)local_178 & 0xffffffff;
                    local_158 = (void *)CONCAT44(local_158._4_4_,(byte)local_118 + 2);
                    lVar28 = 2;
                    local_188 = pFVar12;
                    local_178 = (REF_MPI)(local_118 & 0xff);
                    local_118 = uVar30;
                    do {
                      pRVar4 = ref_grid->cell[lVar28 + -2];
                      uVar9 = ref_cell_ncell(pRVar4,pRVar3,(REF_LONG *)&local_108);
                      if (uVar9 != 0) {
                        pcVar27 = "ncell";
                        uVar21 = 0x8fe;
                        goto LAB_00132951;
                      }
                      if (0 < (long)local_108) {
                        if (ref_grid->mpi->id == 0) {
                          uVar9 = ref_cell_meshb_keyword(pRVar4,(REF_INT *)local_170);
                          if (uVar9 != 0) {
                            pcVar27 = "kw";
                            uVar21 = 0x901;
                            goto LAB_00132951;
                          }
                          iVar8 = pRVar4->node_per;
                          lVar14 = ftell(local_188);
                          lVar29 = (long)(iVar8 + 1 << ((byte)local_158 & 0x1f)) * (long)local_108;
                          sVar13 = fwrite(local_170,4,1,local_188);
                          uVar19 = local_180;
                          if (sVar13 != 1) {
                            pcVar27 = "keyword code";
                            uVar21 = 0x906;
                            sVar11 = 1;
                            goto LAB_00134399;
                          }
                          local_130 = lVar14 + local_118 + lVar29;
                          uVar9 = ref_export_meshb_next_position
                                            ((FILE *)local_188,local_180,local_130);
                          if (uVar9 != 0) {
                            pcVar27 = "next";
                            uVar21 = 0x908;
                            goto LAB_00132951;
                          }
                          RVar10 = ref_gather_meshb_glob
                                             ((FILE *)local_188,uVar19,(REF_GLOB)local_108);
                          if (RVar10 != 0) {
                            pcVar27 = "read ncell";
                            uVar21 = 0x909;
                            goto LAB_001343d2;
                          }
                        }
                        uVar9 = ref_gather_cell(pRVar3,pRVar4,0,1,0,(REF_BOOL)local_178,0,
                                                (REF_INT)local_188,in_stack_fffffffffffffe58,
                                                (FILE *)CONCAT44(in_stack_fffffffffffffe64,
                                                                 in_stack_fffffffffffffe60));
                        if (uVar9 != 0) {
                          pcVar27 = "nodes";
                          uVar21 = 0x90e;
                          goto LAB_00132951;
                        }
                        if ((ref_grid->mpi->id == 0) &&
                           (sVar13 = ftell(local_188), local_130 != sVar13)) {
                          pcVar27 = "cell inconsistent";
                          uVar21 = 0x910;
                          sVar11 = local_130;
                          goto LAB_00134399;
                        }
                      }
                      lVar28 = lVar28 + 1;
                    } while (lVar28 != 0x12);
                    local_e0 = (ulong)(uint)((int)local_e0 * 2);
                    uVar30 = 0;
                    pRVar26 = local_150;
LAB_00133255:
                    local_170[0] = (uint)uVar30 | 0x28;
                    uVar9 = ref_gather_ngeom(pRVar3,pRVar26,(uint)uVar30,(REF_INT *)local_148);
                    pFVar12 = local_188;
                    if (uVar9 != 0) {
                      pcVar27 = "ngeom";
                      uVar21 = 0x916;
                      goto LAB_00132951;
                    }
                    lVar28 = (long)(int)local_148[0];
                    if (lVar28 < 1) goto LAB_00133593;
                    if (ref_grid->mpi->id != 0) {
LAB_00133337:
                      local_178 = pRVar3->ref_mpi;
                      iVar8 = local_178->id;
                      uVar9 = pRVar26->max;
                      if (iVar8 != 0) goto LAB_00133355;
                      if ((int)uVar9 < 1) goto LAB_001336ff;
                      lVar14 = 0;
                      lVar28 = 0;
LAB_001335b3:
                      uVar9 = local_180;
                      pFVar12 = local_188;
                      pRVar5 = pRVar26->descr;
                      if (uVar30 != (uint)pRVar5[lVar28 * 6]) {
LAB_001336d0:
                        lVar28 = lVar28 + 1;
                        uVar9 = local_150->max;
                        lVar14 = lVar14 + 0x10;
                        pRVar26 = local_150;
                        if ((int)uVar9 <= lVar28) goto code_r0x001336ea;
                        goto LAB_001335b3;
                      }
                      iVar8 = pRVar5[lVar28 * 6 + 5];
                      if (local_178->id != pRVar3->part[iVar8]) goto LAB_001336d0;
                      if ((iVar8 < 0) || (pRVar3->max <= iVar8)) {
                        RVar22 = 0;
                      }
                      else {
                        RVar22 = 0;
                        if (-1 < pRVar3->global[iVar8]) {
                          RVar22 = pRVar3->global[iVar8] + 1;
                        }
                      }
                      local_158 = (void *)CONCAT44(local_158._4_4_,pRVar5[lVar28 * 6 + 1]);
                      local_d8[0] = (REF_DBL *)(double)pRVar5[lVar28 * 6 + 2];
                      RVar10 = ref_gather_meshb_glob((FILE *)local_188,local_180,RVar22);
                      if (RVar10 == 0) {
                        RVar10 = ref_gather_meshb_int((FILE *)pFVar12,uVar9,(REF_INT)local_158);
                        if (RVar10 != 0) {
                          pcVar27 = "id";
                          uVar21 = 0x865;
                          goto LAB_00134aef;
                        }
                        uVar25 = uVar30;
                        lVar29 = lVar14;
                        if (uVar30 != 0) {
                          do {
                            sVar11 = fwrite((void *)((long)local_150->param + lVar29),8,1,local_188)
                            ;
                            if (sVar11 != 1) {
                              uVar21 = 0x86a;
                              goto LAB_00134532;
                            }
                            lVar29 = lVar29 + 8;
                            uVar25 = uVar25 - 1;
                          } while (uVar25 != 0);
                          sVar11 = fwrite(local_d8,8,1,local_188);
                          if (sVar11 != 1) goto LAB_00134b8a;
                        }
                        goto LAB_001336d0;
                      }
                      pcVar27 = "node";
                      uVar21 = 0x864;
LAB_00134aef:
                      uVar9 = 1;
                      uVar30 = 1;
                      goto LAB_00134c8a;
                    }
                    uVar25 = (ulong)(local_148[0] * 8);
                    if (uVar30 == 0) {
                      uVar25 = 0;
                    }
                    lVar14 = ftell(local_188);
                    sVar13 = fwrite(local_170,4,1,pFVar12);
                    uVar19 = local_180;
                    if (sVar13 == 1) {
                      local_130 = uVar25 + lVar14 + (local_e0 + uVar30 * 8) * lVar28 + local_118;
                      uVar9 = ref_export_meshb_next_position((FILE *)pFVar12,local_180,local_130);
                      if (uVar9 == 0) {
                        RVar10 = ref_gather_meshb_int((FILE *)pFVar12,uVar19,local_148[0]);
                        pRVar26 = local_150;
                        if (RVar10 == 0) goto LAB_00133337;
                        pcVar27 = "send ngeom";
                        uVar21 = 0x920;
LAB_001343d2:
                        pcVar27 = pcVar27 + 5;
                        uVar9 = 1;
                        uVar30 = 1;
                        goto LAB_00132954;
                      }
                      pcVar27 = "np";
                      uVar21 = 0x91f;
                      goto LAB_00132951;
                    }
                    pcVar27 = "vertex version code";
                    uVar21 = 0x91e;
                    sVar11 = 1;
                    goto LAB_00134399;
                  }
                  pcVar27 = "vertex inconsistent";
                  uVar21 = 0x8fb;
                  sVar11 = local_130;
                }
                else {
                  pcVar27 = "dim inconsistent";
                  uVar21 = 0x8e9;
                }
              }
              else {
                pcVar27 = "dim";
                uVar21 = 0x8e8;
                sVar11 = 1;
              }
            }
            else {
              pcVar27 = "dim code";
              uVar21 = 0x8e6;
              sVar11 = 1;
            }
          }
          else {
            pcVar27 = "version";
            uVar21 = 0x8e2;
            sVar11 = 1;
          }
        }
        else {
          pcVar27 = "code";
          uVar21 = 0x8e1;
          sVar11 = 1;
        }
        goto LAB_00134399;
      }
      printf("unable to open %s\n",filename);
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
             0x8de,"ref_gather_meshb","unable to open file");
      uVar9 = 2;
      goto LAB_0013295b;
    }
    pFVar12 = (FILE *)ref_grid->mpi;
    pRVar3 = ref_grid->node;
    uVar9 = ref_node_synchronize_globals(pRVar3);
    if (uVar9 != 0) {
      pcVar27 = "sync";
      uVar21 = 0x94b;
      goto LAB_00132cad;
    }
    RVar22 = pRVar3->old_n_global;
    uVar9 = ref_cell_ncell(ref_grid->cell[0],pRVar3,(REF_LONG *)local_e8);
    if (uVar9 != 0) {
      pcVar27 = "nedg";
      uVar21 = 0x94e;
      goto LAB_00132cad;
    }
    local_188 = pFVar12;
    uVar9 = ref_cell_ncell(ref_grid->cell[3],pRVar3,(REF_LONG *)local_170);
    if (uVar9 != 0) {
      pcVar27 = "ntri";
      uVar21 = 0x94f;
      goto LAB_00132cad;
    }
    uVar9 = ref_cell_ncell(ref_grid->cell[8],pRVar3,(REF_LONG *)local_148);
    pFVar12 = local_188;
    if (uVar9 != 0) {
      pcVar27 = "ntet";
      uVar21 = 0x950;
      goto LAB_00132cad;
    }
    if (ref_grid->twod == 0) {
      uVar9 = ref_grid_faceid_range(ref_grid,(REF_INT *)&local_10c,&local_134);
      pFVar12 = local_188;
      if (uVar9 == 0) goto LAB_001339c5;
      pcVar27 = "range";
      uVar21 = 0x956;
      goto LAB_00132cad;
    }
    uVar9 = ref_cell_id_range(ref_grid->cell[0],(REF_MPI)local_188,(REF_INT *)&local_10c,&local_134)
    ;
    if (uVar9 != 0) {
      pcVar27 = "range";
      uVar21 = 0x954;
      goto LAB_00132cad;
    }
LAB_001339c5:
    if (*(int *)&pFVar12->field_0x4 == 0) {
      iVar8 = local_134 - local_10c;
      uStack_7c = 0x4853;
      local_80 = 0x454d5641;
      local_8c = 1;
      uVar9 = 2;
      local_90 = 2;
      local_94 = 1;
      in_stack_fffffffffffffe64 = in_stack_fffffffffffffe64 & 0xffffff;
      local_58 = 0x656e69;
      local_60 = 0x6665722f4153414e;
      local_98 = 2;
      uStack_ac = 0x656e;
      local_b0 = 0x69666572;
      local_168._0_1_ = 'S';
      local_168._1_1_ = 'k';
      local_168._2_1_ = 'e';
      local_168._3_1_ = 't';
      local_168._4_1_ = 'c';
      local_168._5_1_ = 'h';
      local_168._6_1_ = '2';
      local_168._7_1_ = 'S';
      builtin_strncpy(acStack_160,"olution",8);
      local_40 = 0x63757274736e75;
      uStack_84 = 0x656e;
      local_88 = 0x69666572;
      local_179 = '\0';
      uStack_f8 = 0x6e6f697475;
      local_108 = (REF_GLOB *)0x6b53656e69666572;
      uStack_100 = 0x533268637465;
      uStack_fa = 0x6c6f;
      local_48 = 0x3ff0000000000000;
      local_9c = 0;
      local_50 = 0x6d726f66696e75;
      pFVar12 = fopen(filename,"w");
      if (pFVar12 == (FILE *)0x0) {
        printf("unable to open %s\n",filename);
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
               0x974,"ref_gather_avm","unable to open file");
      }
      else {
        sVar11 = fwrite(&local_80,1,6,pFVar12);
        if (sVar11 != 6) {
          pcVar27 = "magic_string";
          sVar13 = 6;
          uVar21 = 0x976;
          goto LAB_00134e11;
        }
        sVar11 = fwrite(&local_8c,4,1,pFVar12);
        if (sVar11 != 1) {
          pcVar27 = "magic_number";
          sVar13 = 1;
          uVar21 = 0x978;
          goto LAB_00134e11;
        }
        sVar11 = fwrite(&local_90,4,1,pFVar12);
        if (sVar11 != 1) {
          pcVar27 = "revision_number";
          sVar13 = 1;
          uVar21 = 0x97a;
          goto LAB_00134e11;
        }
        sVar11 = fwrite(&local_94,4,1,pFVar12);
        if (sVar11 != 1) {
          pcVar27 = "n_meshes";
          sVar13 = 1;
          uVar21 = 0x97b;
          goto LAB_00134e11;
        }
        sVar11 = strlen((char *)&local_60);
        iVar23 = (int)sVar11;
        sVar13 = (size_t)iVar23;
        sVar11 = fwrite(&local_60,1,sVar13,pFVar12);
        if (sVar13 != sVar11) {
          pcVar27 = "contact_info";
          uVar21 = 0x97f;
          goto LAB_00134e11;
        }
        iVar18 = 0x80 - iVar23;
        if (iVar23 < 0x80) {
          iVar23 = 0;
          do {
            sVar11 = fwrite(&stack0xfffffffffffffe67,1,1,pFVar12);
            if (sVar11 != 1) {
              pcVar27 = "nul";
              sVar13 = 1;
              uVar21 = 0x982;
              goto LAB_00134e11;
            }
            iVar23 = iVar23 + 1;
          } while (iVar23 < iVar18);
        }
        sVar11 = fwrite(&local_98,4,1,pFVar12);
        if (sVar11 != 1) {
          pcVar27 = "precision";
          sVar13 = 1;
          uVar21 = 0x984;
          goto LAB_00134e11;
        }
        local_34 = (ref_grid->twod == 0) + 2;
        sVar11 = fwrite(&local_34,4,1,pFVar12);
        if (sVar11 != 1) {
          pcVar27 = "dimension";
          sVar13 = 1;
          uVar21 = 0x986;
          goto LAB_00134e11;
        }
        sVar11 = strlen((char *)&local_b0);
        iVar23 = (int)sVar11;
        sVar11 = fwrite(&stack0xfffffffffffffe60,4,1,pFVar12);
        if (sVar11 != 1) {
          pcVar27 = "length";
          sVar13 = 1;
          uVar21 = 0x988;
          goto LAB_00134e11;
        }
        sVar13 = (size_t)iVar23;
        sVar11 = fwrite(&local_b0,1,sVar13,pFVar12);
        if (sVar11 != sVar13) {
          pcVar27 = "file_description";
          uVar21 = 0x98b;
          goto LAB_00134e11;
        }
        sVar11 = strlen((char *)&local_168);
        iVar23 = (int)sVar11;
        sVar13 = (size_t)iVar23;
        sVar11 = fwrite(&local_168,1,sVar13,pFVar12);
        if (sVar13 != sVar11) {
          pcVar27 = "mesh_name";
          uVar21 = 0x98e;
          goto LAB_00134e11;
        }
        iVar18 = 0x80 - iVar23;
        if (iVar23 < 0x80) {
          iVar23 = 0;
          do {
            sVar11 = fwrite(&stack0xfffffffffffffe67,1,1,pFVar12);
            if (sVar11 != 1) {
              pcVar27 = "nul";
              sVar13 = 1;
              uVar21 = 0x991;
              goto LAB_00134e11;
            }
            iVar23 = iVar23 + 1;
          } while (iVar23 < iVar18);
        }
        sVar11 = strlen((char *)&local_40);
        iVar23 = (int)sVar11;
        sVar13 = (size_t)iVar23;
        sVar11 = fwrite(&local_40,1,sVar13,pFVar12);
        if (sVar13 != sVar11) {
          pcVar27 = "mesh_type";
          uVar21 = 0x995;
          goto LAB_00134e11;
        }
        iVar18 = 0x80 - iVar23;
        if (iVar23 < 0x80) {
          iVar23 = 0;
          do {
            sVar11 = fwrite(&stack0xfffffffffffffe67,1,1,pFVar12);
            if (sVar11 != 1) {
              pcVar27 = "nul";
              sVar13 = 1;
              uVar21 = 0x998;
              goto LAB_00134e11;
            }
            iVar23 = iVar23 + 1;
          } while (iVar23 < iVar18);
        }
        sVar11 = strlen((char *)&local_88);
        iVar23 = (int)sVar11;
        sVar13 = (size_t)iVar23;
        sVar11 = fwrite(&local_88,1,sVar13,pFVar12);
        if (sVar13 != sVar11) {
          pcVar27 = "mesh_generator";
          uVar21 = 0x99d;
          goto LAB_00134e11;
        }
        iVar18 = 0x80 - iVar23;
        if (iVar23 < 0x80) {
          iVar23 = 0;
          do {
            sVar11 = fwrite(&stack0xfffffffffffffe67,1,1,pFVar12);
            if (sVar11 != 1) {
              pcVar27 = "nul";
              sVar13 = 1;
              uVar21 = 0x9a0;
              goto LAB_00134e11;
            }
            iVar23 = iVar23 + 1;
          } while (iVar23 < iVar18);
        }
        if (ref_grid->twod != 0) {
switchD_001350ee_caseD_1:
          uStack_138 = 0x4c7a;
          local_13c = 0x55794278;
          goto switchD_001350ee_default;
        }
        if (((ref_grid->geom->model != (void *)0x0) &&
            (RVar10 = ref_egads_get_attribute
                                (ref_grid->geom,3,-1,"av:coordinate_system",(char **)local_d8),
            RVar10 == 0)) &&
           (uVar9 = ref_grid_parse_coordinate_system(ref_grid,(char *)local_d8[0]), uVar9 != 0)) {
          pcVar27 = "parse av coor sys";
          uVar21 = 0x9ad;
          goto LAB_00132cad;
        }
        switch(ref_grid->coordinate_system) {
        case REF_GRID_XBYRZU:
          uStack_138 = 0x557a;
          local_13c = 0x52794278;
          break;
        case REF_GRID_XBYUZL:
          goto switchD_001350ee_caseD_1;
        case REF_GRID_XFYRZD:
          uStack_138 = 0x447a;
          local_13c = 0x52794678;
          break;
        case REF_GRID_COORDSYS_LAST:
          pcVar27 = "REF_GRID_COORDSYS_LAST";
          uVar21 = 0x9ba;
          goto LAB_00135531;
        }
switchD_001350ee_default:
        sVar11 = strlen((char *)&local_13c);
        iVar23 = (int)sVar11;
        sVar13 = (size_t)iVar23;
        sVar11 = fwrite(&local_13c,1,sVar13,pFVar12);
        if (sVar13 == sVar11) {
          iVar18 = 0x80 - iVar23;
          if (iVar23 < 0x80) {
            iVar23 = 0;
            do {
              sVar11 = fwrite(&stack0xfffffffffffffe67,1,1,pFVar12);
              if (sVar11 != 1) {
                pcVar27 = "nul";
                sVar13 = 1;
                uVar21 = 0x9c3;
                goto LAB_00134e11;
              }
              iVar23 = iVar23 + 1;
            } while (iVar23 < iVar18);
          }
          sVar11 = fwrite(&local_48,8,1,pFVar12);
          if (sVar11 != 1) {
            pcVar27 = "model_scale";
            sVar13 = 1;
            uVar21 = 0x9c5;
            goto LAB_00134e11;
          }
          if (((ref_grid->geom->model != (void *)0x0) &&
              (RVar10 = ref_egads_get_attribute
                                  (ref_grid->geom,3,-1,"av:mesh_units",(char **)local_d8),
              RVar10 == 0)) &&
             (uVar9 = ref_grid_parse_unit(ref_grid,(char *)local_d8[0]), uVar9 != 0)) {
            pcVar27 = "parse unit";
            uVar21 = 0x9cd;
            goto LAB_00132cad;
          }
          switch(ref_grid->unit) {
          case REF_GRID_IN:
            local_124 = (uint)local_124._3_1_ << 0x18;
            local_124 = CONCAT22(local_124._2_2_,0x6e69);
            break;
          case REF_GRID_FT:
            local_124 = (uint)local_124._3_1_ << 0x18;
            local_124 = CONCAT22(local_124._2_2_,0x7466);
            break;
          case REF_GRID_M:
            local_124 = CONCAT22(local_124._2_2_,0x6d);
            break;
          case REF_GRID_CM:
            local_124 = (uint)local_124._3_1_ << 0x18;
            local_124 = CONCAT22(local_124._2_2_,0x6d63);
            break;
          case REF_GRID_UNIT_LAST:
            pcVar27 = "REF_GRID_UNIT_LAST";
            uVar21 = 0x9dd;
LAB_00135531:
            printf("%s: %d: %s: %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                   ,uVar21,"ref_gather_avm",pcVar27);
            goto LAB_00134e18;
          }
          sVar11 = strlen((char *)&local_124);
          iVar23 = (int)sVar11;
          sVar13 = (size_t)iVar23;
          sVar11 = fwrite(&local_124,1,sVar13,pFVar12);
          if (sVar13 == sVar11) {
            iVar18 = 0x80 - iVar23;
            if (iVar23 < 0x80) {
              iVar23 = 0;
              do {
                sVar11 = fwrite(&stack0xfffffffffffffe67,1,1,pFVar12);
                if (sVar11 != 1) {
                  pcVar27 = "nul";
                  sVar13 = 1;
                  uVar21 = 0x9e4;
                  goto LAB_00134e11;
                }
                iVar23 = iVar23 + 1;
              } while (iVar23 < iVar18);
            }
            if (((ref_grid->geom->model != (void *)0x0) &&
                (RVar10 = ref_egads_get_real_attribute
                                    (ref_grid->geom,3,-1,"av:reference",local_d8,
                                     (REF_INT *)&stack0xfffffffffffffe60), RVar10 == 0)) &&
               (iVar18 == 7)) {
              lVar28 = 0;
              do {
                ref_grid->references[lVar28] = local_d8[0][lVar28];
                lVar28 = lVar28 + 1;
              } while (lVar28 != 7);
            }
            sVar11 = fwrite(ref_grid->references,8,7,pFVar12);
            if (sVar11 == 7) {
              sVar11 = strlen(&local_179);
              iVar23 = (int)sVar11;
              sVar13 = (size_t)iVar23;
              sVar11 = fwrite(&local_179,1,sVar13,pFVar12);
              if (sVar13 == sVar11) {
                iVar18 = 0x80 - iVar23;
                if (iVar23 < 0x80) {
                  iVar23 = 0;
                  do {
                    sVar11 = fwrite(&stack0xfffffffffffffe67,1,1,pFVar12);
                    if (sVar11 != 1) {
                      pcVar27 = "nul";
                      sVar13 = 1;
                      uVar21 = 0x9fa;
                      goto LAB_00134e11;
                    }
                    iVar23 = iVar23 + 1;
                  } while (iVar23 < iVar18);
                }
                sVar11 = fwrite(&local_9c,4,1,pFVar12);
                if (sVar11 == 1) {
                  sVar11 = strlen((char *)&local_108);
                  iVar23 = (int)sVar11;
                  sVar13 = (size_t)iVar23;
                  sVar11 = fwrite(&local_108,1,sVar13,pFVar12);
                  if (sVar13 == sVar11) {
                    iVar18 = 0x80 - iVar23;
                    if (iVar23 < 0x80) {
                      iVar23 = 0;
                      do {
                        sVar11 = fwrite(&stack0xfffffffffffffe67,1,1,pFVar12);
                        if (sVar11 != 1) {
                          pcVar27 = "nul";
                          sVar13 = 1;
                          uVar21 = 0xa03;
                          goto LAB_00134e11;
                        }
                        iVar23 = iVar23 + 1;
                      } while (iVar23 < iVar18);
                    }
                    local_18c = (uint)RVar22;
                    sVar11 = fwrite(&local_18c,4,1,pFVar12);
                    if (sVar11 == 1) {
                      if (ref_grid->twod == 0) {
                        iVar23 = local_148[0] * 4 + local_170[0];
                      }
                      else {
                        iVar23 = local_170[0] * 3 + local_e8[0];
                      }
                      local_18c = iVar23 / 2;
                      sVar11 = fwrite(&local_18c,4,1,pFVar12);
                      if (sVar11 == 1) {
                        puVar17 = local_170;
                        if (ref_grid->twod == 0) {
                          puVar17 = local_148;
                        }
                        local_18c = *puVar17;
                        sVar11 = fwrite(&local_18c,4,1,pFVar12);
                        if (sVar11 == 1) {
                          if (ref_grid->twod == 0) {
                            local_18c = 3;
                            sVar11 = fwrite(&local_18c,4,1,pFVar12);
                            if (sVar11 == 1) {
                              local_18c = 4;
                              sVar11 = fwrite(&local_18c,4,1,pFVar12);
                              if (sVar11 == 1) {
                                local_18c = 4;
                                sVar11 = fwrite(&local_18c,4,1,pFVar12);
                                if (sVar11 == 1) goto LAB_001358b9;
                                pcVar27 = "max faces per cell";
                                sVar13 = 1;
                                uVar21 = 0xa20;
                              }
                              else {
                                pcVar27 = "max nodes per cell";
                                sVar13 = 1;
                                uVar21 = 0xa1e;
                              }
                            }
                            else {
                              pcVar27 = "max nodes per face";
                              sVar13 = 1;
                              uVar21 = 0xa1c;
                            }
                          }
                          else {
                            local_18c = 2;
                            sVar11 = fwrite(&local_18c,4,1,pFVar12);
                            if (sVar11 == 1) {
                              local_18c = 3;
                              sVar11 = fwrite(&local_18c,4,1,pFVar12);
                              if (sVar11 == 1) {
                                local_18c = 3;
                                sVar11 = fwrite(&local_18c,4,1,pFVar12);
                                if (sVar11 == 1) {
LAB_001358b9:
                                  sVar11 = strlen((char *)&local_50);
                                  iVar23 = (int)sVar11;
                                  sVar13 = (size_t)iVar23;
                                  sVar11 = fwrite(&local_50,1,sVar13,pFVar12);
                                  if (sVar13 == sVar11) {
                                    iVar18 = 0x20 - iVar23;
                                    if (iVar23 < 0x20) {
                                      iVar23 = 0;
                                      do {
                                        sVar11 = fwrite(&stack0xfffffffffffffe67,1,1,pFVar12);
                                        if (sVar11 != 1) {
                                          pcVar27 = "nul";
                                          sVar13 = 1;
                                          uVar21 = 0xa28;
                                          goto LAB_00134e11;
                                        }
                                        iVar23 = iVar23 + 1;
                                      } while (iVar23 < iVar18);
                                    }
                                    local_18c = 1;
                                    sVar11 = fwrite(&local_18c,4,1,pFVar12);
                                    if (sVar11 == 1) {
                                      local_18c = 1;
                                      sVar11 = fwrite(&local_18c,4,1,pFVar12);
                                      if (sVar11 == 1) {
                                        local_18c = iVar8 + 1;
                                        sVar11 = fwrite(&local_18c,4,1,pFVar12);
                                        if (sVar11 == 1) {
                                          local_18c = 0;
                                          sVar11 = fwrite(&local_18c,4,1,pFVar12);
                                          if (sVar11 == 1) {
                                            puVar17 = local_148;
                                            if (ref_grid->twod != 0) {
                                              puVar17 = local_170;
                                            }
                                            local_18c = *puVar17;
                                            sVar11 = fwrite(&local_18c,4,1,pFVar12);
                                            if (sVar11 == 1) {
                                              local_18c = 0;
                                              sVar11 = fwrite(&local_18c,4,1,pFVar12);
                                              if (sVar11 == 1) {
                                                local_18c = 0;
                                                sVar11 = fwrite(&local_18c,4,1,pFVar12);
                                                if (sVar11 == 1) {
                                                  puVar17 = local_e8;
                                                  if (ref_grid->twod == 0) {
                                                    puVar17 = local_170;
                                                  }
                                                  local_18c = *puVar17;
                                                  sVar11 = fwrite(&local_18c,4,1,pFVar12);
                                                  if (sVar11 == 1) {
                                                    sVar11 = fwrite(&local_18c,4,1,pFVar12);
                                                    if (sVar11 == 1) {
                                                      local_18c = 0;
                                                      sVar11 = fwrite(&local_18c,4,1,pFVar12);
                                                      if (sVar11 == 1) {
                                                        sVar11 = fwrite(&local_18c,4,1,pFVar12);
                                                        if (sVar11 == 1) {
                                                          in_stack_fffffffffffffe60 = 5;
                                                          iVar8 = 0;
                                                          do {
                                                            local_18c = 0;
                                                            sVar11 = fwrite(&local_18c,4,1,pFVar12);
                                                            if (sVar11 != 1) {
                                                              pcVar27 = "zeros";
                                                              sVar13 = 1;
                                                              uVar21 = 0xa49;
                                                              goto LAB_00134e11;
                                                            }
                                                            iVar8 = iVar8 + 1;
                                                          } while (iVar8 < in_stack_fffffffffffffe60
                                                                  );
                                                          uVar9 = local_10c;
                                                          if ((int)local_10c <= local_134) {
                                                            do {
                                                              local_150 = ref_grid->geom;
                                                              iVar8 = (ref_grid->twod == 0) + 1;
                                                              RVar10 = ref_egads_get_attribute
                                                                                 (local_150,iVar8,
                                                                                  uVar9,
                                                  "av:patch_label",&local_68);
                                                  if (RVar10 != 0) {
                                                    local_68 = "unknown";
                                                  }
                                                  snprintf((char *)local_d8,0x21,"%s-%d",local_68,
                                                           (ulong)uVar9);
                                                  sVar11 = strlen((char *)local_d8);
                                                  iVar23 = (int)sVar11;
                                                  sVar13 = (size_t)iVar23;
                                                  sVar11 = fwrite(local_d8,1,sVar13,pFVar12);
                                                  if (sVar13 != sVar11) {
                                                    pcVar27 = "patch_label";
                                                    uVar21 = 0xa5a;
                                                    goto LAB_00134e11;
                                                  }
                                                  iVar18 = 0x20 - iVar23;
                                                  if (iVar23 < 0x20) {
                                                    iVar23 = 0;
                                                    do {
                                                      sVar11 = fwrite(&stack0xfffffffffffffe67,1,1,
                                                                      pFVar12);
                                                      if (sVar11 != 1) {
                                                        pcVar27 = "nul";
                                                        sVar13 = 1;
                                                        uVar21 = 0xa5d;
                                                        goto LAB_00134e11;
                                                      }
                                                      iVar23 = iVar23 + 1;
                                                    } while (iVar23 < iVar18);
                                                  }
                                                  RVar10 = ref_egads_get_attribute
                                                                     (local_150,iVar8,uVar9,
                                                                      "av:patch_type",&local_70);
                                                  if (local_70 == (char *)0x0 || RVar10 != 0) {
                                                    local_70 = "unknown";
                                                  }
                                                  pcVar27 = local_70;
                                                  sVar11 = strlen(local_70);
                                                  iVar8 = (int)sVar11;
                                                  sVar13 = (size_t)iVar8;
                                                  sVar11 = fwrite(pcVar27,1,sVar13,pFVar12);
                                                  if (sVar13 != sVar11) {
                                                    pcVar27 = "patch_label";
                                                    uVar21 = 0xa66;
                                                    goto LAB_00134e11;
                                                  }
                                                  in_stack_fffffffffffffe60 = 0x10 - iVar8;
                                                  if (iVar8 < 0x10) {
                                                    iVar8 = 0;
                                                    do {
                                                      sVar11 = fwrite(&stack0xfffffffffffffe67,1,1,
                                                                      pFVar12);
                                                      if (sVar11 != 1) {
                                                        pcVar27 = "nul";
                                                        sVar13 = 1;
                                                        uVar21 = 0xa69;
                                                        goto LAB_00134e11;
                                                      }
                                                      iVar8 = iVar8 + 1;
                                                    } while (iVar8 < in_stack_fffffffffffffe60);
                                                  }
                                                  local_18c = -uVar9;
                                                  sVar11 = fwrite(&local_18c,4,1,pFVar12);
                                                  if (sVar11 != 1) {
                                                    pcVar27 = "patch ID";
                                                    sVar13 = 1;
                                                    uVar21 = 0xa6c;
                                                    goto LAB_00134e11;
                                                  }
                                                  bVar31 = (int)uVar9 < local_134;
                                                  uVar9 = uVar9 + 1;
                                                  } while (bVar31);
                                                  }
                                                  goto LAB_001339d1;
                                                  }
                                                  pcVar27 = "# quad faces";
                                                  sVar13 = 1;
                                                  uVar21 = 0xa45;
                                                  }
                                                  else {
                                                    pcVar27 = "# boundary quad faces";
                                                    sVar13 = 1;
                                                    uVar21 = 0xa44;
                                                  }
                                                  }
                                                  else {
                                                    pcVar27 = "# tri faces";
                                                    sVar13 = 1;
                                                    uVar21 = 0xa42;
                                                  }
                                                  }
                                                  else {
                                                    pcVar27 = "# boundary tri faces";
                                                    sVar13 = 1;
                                                    uVar21 = 0xa41;
                                                  }
                                                }
                                                else {
                                                  pcVar27 = "npyr";
                                                  sVar13 = 1;
                                                  uVar21 = 0xa3b;
                                                }
                                              }
                                              else {
                                                pcVar27 = "npri";
                                                sVar13 = 1;
                                                uVar21 = 0xa39;
                                              }
                                            }
                                            else {
                                              pcVar27 = "ntet";
                                              sVar13 = 1;
                                              uVar21 = 0xa37;
                                            }
                                          }
                                          else {
                                            pcVar27 = "nhex";
                                            sVar13 = 1;
                                            uVar21 = 0xa31;
                                          }
                                        }
                                        else {
                                          pcVar27 = "# boundary patches";
                                          sVar13 = 1;
                                          uVar21 = 0xa2f;
                                        }
                                      }
                                      else {
                                        pcVar27 = "cell polynomial order";
                                        sVar13 = 1;
                                        uVar21 = 0xa2d;
                                      }
                                    }
                                    else {
                                      pcVar27 = "face polynomial order";
                                      sVar13 = 1;
                                      uVar21 = 0xa2b;
                                    }
                                  }
                                  else {
                                    pcVar27 = "element_scheme";
                                    uVar21 = 0xa25;
                                  }
                                }
                                else {
                                  pcVar27 = "max faces per cell";
                                  sVar13 = 1;
                                  uVar21 = 0xa19;
                                }
                              }
                              else {
                                pcVar27 = "max nodes per cell";
                                sVar13 = 1;
                                uVar21 = 0xa17;
                              }
                            }
                            else {
                              pcVar27 = "max nodes per face";
                              sVar13 = 1;
                              uVar21 = 0xa15;
                            }
                          }
                        }
                        else {
                          pcVar27 = "ncells";
                          sVar13 = 1;
                          uVar21 = 0xa12;
                        }
                      }
                      else {
                        pcVar27 = "nfaces";
                        sVar13 = 1;
                        uVar21 = 0xa0c;
                      }
                    }
                    else {
                      pcVar27 = "nodes";
                      sVar13 = 1;
                      uVar21 = 0xa06;
                    }
                  }
                  else {
                    pcVar27 = "mesh_description";
                    uVar21 = 0xa00;
                  }
                }
                else {
                  pcVar27 = "refined";
                  sVar13 = 1;
                  uVar21 = 0x9fc;
                }
              }
              else {
                pcVar27 = "ref_point_desc";
                uVar21 = 0x9f7;
              }
            }
            else {
              pcVar27 = "reference";
              sVar13 = 7;
              uVar21 = 0x9f3;
            }
          }
          else {
            pcVar27 = "mesh_units";
            uVar21 = 0x9e1;
          }
        }
        else {
          pcVar27 = "coordinate_system";
          uVar21 = 0x9c0;
        }
LAB_00134e11:
        printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
               uVar21,"ref_gather_avm",pcVar27,sVar13,sVar11);
LAB_00134e18:
        uVar9 = 1;
      }
    }
    else {
      pFVar12 = (FILE *)0x0;
LAB_001339d1:
      uVar9 = ref_gather_node(pRVar3,0,0,0,(FILE *)pFVar12);
      if (uVar9 == 0) {
        RVar32 = (REF_INT)pFVar12;
        if (ref_grid->twod == 0) {
          pRVar4 = ref_grid->cell[3];
          iVar8 = pRVar4->max;
          if (0 < iVar8) {
            pRVar5 = pRVar4->c2n;
            iVar23 = 0;
            do {
              lVar28 = (long)iVar23 * (long)pRVar4->size_per;
              if (pRVar5[lVar28] != -1) {
                piVar2 = pRVar5 + (long)(int)lVar28 + (long)pRVar4->node_per;
                *piVar2 = -*piVar2;
                iVar8 = pRVar4->max;
              }
              iVar23 = iVar23 + 1;
            } while (iVar23 < iVar8);
          }
          uVar9 = ref_gather_cell(pRVar3,pRVar4,0,1,0,0,0,RVar32,in_stack_fffffffffffffe58,
                                  (FILE *)CONCAT44(in_stack_fffffffffffffe64,
                                                   in_stack_fffffffffffffe60));
          if (uVar9 == 0) {
            RVar20 = pRVar4->max;
            if (0 < RVar20) {
              pRVar5 = pRVar4->c2n;
              iVar8 = 0;
              do {
                lVar28 = (long)iVar8 * (long)pRVar4->size_per;
                if (pRVar5[lVar28] != -1) {
                  piVar2 = pRVar5 + (long)(int)lVar28 + (long)pRVar4->node_per;
                  *piVar2 = -*piVar2;
                  RVar20 = pRVar4->max;
                }
                iVar8 = iVar8 + 1;
              } while (iVar8 < RVar20);
            }
            goto LAB_0013457f;
          }
          pcVar27 = "nodes";
          uVar21 = 0xa9f;
        }
        else {
          pRVar4 = ref_grid->cell[0];
          iVar8 = pRVar4->max;
          if (0 < iVar8) {
            pRVar5 = pRVar4->c2n;
            iVar23 = 0;
            do {
              lVar28 = (long)iVar23 * (long)pRVar4->size_per;
              if (pRVar5[lVar28] != -1) {
                piVar2 = pRVar5 + (long)(int)lVar28 + (long)pRVar4->node_per;
                *piVar2 = -*piVar2;
                iVar8 = pRVar4->max;
              }
              iVar23 = iVar23 + 1;
            } while (iVar23 < iVar8);
          }
          uVar9 = ref_gather_cell(pRVar3,pRVar4,0,1,0,0,1,RVar32,in_stack_fffffffffffffe58,
                                  (FILE *)CONCAT44(in_stack_fffffffffffffe64,
                                                   in_stack_fffffffffffffe60));
          if (uVar9 == 0) {
            iVar8 = pRVar4->max;
            if (0 < iVar8) {
              pRVar5 = pRVar4->c2n;
              iVar23 = 0;
              do {
                lVar28 = (long)iVar23 * (long)pRVar4->size_per;
                if (pRVar5[lVar28] != -1) {
                  piVar2 = pRVar5 + (long)(int)lVar28 + (long)pRVar4->node_per;
                  *piVar2 = -*piVar2;
                  iVar8 = pRVar4->max;
                }
                iVar23 = iVar23 + 1;
              } while (iVar23 < iVar8);
            }
LAB_0013457f:
            if (ref_grid->twod == 0) {
              uVar9 = ref_gather_cell(pRVar3,ref_grid->cell[8],0,0,0,0,0,RVar32,
                                      in_stack_fffffffffffffe58,
                                      (FILE *)CONCAT44(in_stack_fffffffffffffe64,
                                                       in_stack_fffffffffffffe60));
              if (uVar9 == 0) goto LAB_00134792;
              pcVar27 = "nodes";
              uVar21 = 0xacc;
            }
            else {
              pRVar4 = ref_grid->cell[3];
              iVar8 = pRVar4->max;
              if (0 < iVar8) {
                pRVar5 = pRVar4->c2n;
                iVar23 = 0;
                do {
                  lVar28 = (long)pRVar4->size_per * (long)iVar23;
                  if (pRVar5[lVar28] != -1) {
                    RVar20 = pRVar5[lVar28 + 2];
                    pRVar5[lVar28 + 2] = pRVar5[lVar28 + 1];
                    pRVar5[(long)pRVar4->size_per * (long)iVar23 + 1] = RVar20;
                    iVar8 = pRVar4->max;
                  }
                  iVar23 = iVar23 + 1;
                } while (iVar23 < iVar8);
              }
              uVar9 = ref_gather_cell(pRVar3,pRVar4,0,0,0,0,1,RVar32,in_stack_fffffffffffffe58,
                                      (FILE *)CONCAT44(in_stack_fffffffffffffe64,
                                                       in_stack_fffffffffffffe60));
              if (uVar9 == 0) {
                iVar8 = pRVar4->max;
                if (0 < iVar8) {
                  pRVar5 = pRVar4->c2n;
                  iVar23 = 0;
                  do {
                    lVar28 = (long)pRVar4->size_per * (long)iVar23;
                    if (pRVar5[lVar28] != -1) {
                      RVar32 = pRVar5[lVar28 + 2];
                      pRVar5[lVar28 + 2] = pRVar5[lVar28 + 1];
                      pRVar5[(long)pRVar4->size_per * (long)iVar23 + 1] = RVar32;
                      iVar8 = pRVar4->max;
                    }
                    iVar23 = iVar23 + 1;
                  } while (iVar23 < iVar8);
                }
LAB_00134792:
                iVar8 = *(int *)&local_188->field_0x4;
                goto joined_r0x00133aa7;
              }
              pcVar27 = "nodes";
              uVar21 = 0xab9;
            }
          }
          else {
            pcVar27 = "nodes";
            uVar21 = 0xa89;
          }
        }
      }
      else {
        pcVar27 = "nodes";
        uVar21 = 0xa75;
      }
LAB_00132cad:
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
             uVar21,"ref_gather_avm",(ulong)uVar9,pcVar27);
    }
    pcVar27 = "scalar plt";
    uVar21 = 0xb6e;
LAB_00132679:
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",uVar21
           ,"ref_gather_by_extension",(ulong)uVar9,pcVar27);
    return uVar9;
  }
  pRVar3 = ref_grid->node;
  uVar9 = ref_node_synchronize_globals(pRVar3);
  if (uVar9 != 0) {
    pcVar27 = "sync";
    uVar21 = 0x43d;
    goto LAB_0013264e;
  }
  if (ref_grid->mpi->id == 0) {
    pFVar12 = fopen(filename,"w");
    if (pFVar12 != (FILE *)0x0) {
      fwrite("title=\"geometry\"\n",0x11,1,pFVar12);
      fwrite("variables = \"x\" \"y\" \"z\"\n",0x18,1,pFVar12);
      goto LAB_001325fe;
    }
    printf("unable to open %s\n",filename);
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",0x443,
           "ref_gather_tec","unable to open file");
    uVar9 = 2;
LAB_00132658:
    pcVar27 = "scalar tec";
    uVar21 = 0xb69;
    goto LAB_00132679;
  }
  pFVar12 = (FILE *)0x0;
LAB_001325fe:
  pRVar4 = ref_grid->cell[0];
  uVar9 = ref_grid_compact_cell_nodes
                    (ref_grid,pRVar4,(REF_GLOB *)local_d8,(REF_LONG *)&local_168,&local_108);
  if (uVar9 != 0) {
    pcVar27 = "l2c";
    uVar21 = 1099;
LAB_0013264e:
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",uVar21
           ,"ref_gather_tec",(ulong)uVar9,pcVar27);
    goto LAB_00132658;
  }
  if (0 < (long)local_168 && 0 < (long)local_d8[0]) {
    if (ref_grid->mpi->id == 0) {
      fprintf(pFVar12,"zone t=\"edge\", nodes=%ld, elements=%ld, datapacking=%s, zonetype=%s\n",
              local_d8[0],local_168,"point","felineseg");
    }
    uVar9 = ref_gather_node_tec_part
                      (pRVar3,(REF_GLOB)local_d8[0],local_108,0,(REF_DBL *)0x0,(FILE *)pFVar12);
    if (uVar9 == 0) {
      uVar9 = ref_gather_cell_tec(pRVar3,pRVar4,local_168,local_108,0,(FILE *)pFVar12);
      if (uVar9 == 0) goto LAB_00132a13;
      pcVar27 = "nodes";
      uVar21 = 0x456;
    }
    else {
      pcVar27 = "nodes";
      uVar21 = 0x454;
    }
    goto LAB_0013264e;
  }
LAB_00132a13:
  if (local_108 != (REF_GLOB *)0x0) {
    free(local_108);
  }
  pRVar4 = ref_grid->cell[3];
  uVar9 = ref_grid_compact_cell_nodes
                    (ref_grid,pRVar4,(REF_GLOB *)local_d8,(REF_LONG *)&local_168,&local_108);
  if (uVar9 != 0) {
    pcVar27 = "l2c";
    uVar21 = 0x45c;
    goto LAB_0013264e;
  }
  if (0 < (long)local_168 && 0 < (long)local_d8[0]) {
    if (ref_grid->mpi->id == 0) {
      fprintf(pFVar12,"zone t=\"face\", nodes=%ld, elements=%ld, datapacking=%s, zonetype=%s\n",
              local_d8[0],local_168,"point","fetriangle");
    }
    uVar9 = ref_gather_node_tec_part
                      (pRVar3,(REF_GLOB)local_d8[0],local_108,0,(REF_DBL *)0x0,(FILE *)pFVar12);
    if (uVar9 == 0) {
      uVar9 = ref_gather_cell_tec(pRVar3,pRVar4,local_168,local_108,0,(FILE *)pFVar12);
      if (uVar9 == 0) goto LAB_00132dac;
      pcVar27 = "nodes";
      uVar21 = 0x467;
    }
    else {
      pcVar27 = "nodes";
      uVar21 = 0x465;
    }
    goto LAB_0013264e;
  }
LAB_00132dac:
  if (local_108 != (REF_GLOB *)0x0) {
    free(local_108);
  }
  pRVar4 = ref_grid->cell[8];
  uVar9 = ref_grid_compact_cell_nodes
                    (ref_grid,pRVar4,(REF_GLOB *)local_d8,(REF_LONG *)&local_168,&local_108);
  if (uVar9 != 0) {
    pcVar27 = "l2c";
    uVar21 = 0x46d;
    goto LAB_0013264e;
  }
  if (0 < (long)local_168 && 0 < (long)local_d8[0]) {
    if (ref_grid->mpi->id == 0) {
      fprintf(pFVar12,"zone t=\"tet\", nodes=%ld, elements=%ld, datapacking=%s, zonetype=%s\n",
              local_d8[0],local_168,"point","fetetrahedron");
    }
    uVar9 = ref_gather_node_tec_part
                      (pRVar3,(REF_GLOB)local_d8[0],local_108,0,(REF_DBL *)0x0,(FILE *)pFVar12);
    if (uVar9 == 0) {
      uVar9 = ref_gather_cell_tec(pRVar3,pRVar4,local_168,local_108,0,(FILE *)pFVar12);
      if (uVar9 == 0) goto LAB_00133a8e;
      pcVar27 = "nodes";
      uVar21 = 0x478;
    }
    else {
      pcVar27 = "nodes";
      uVar21 = 0x476;
    }
    goto LAB_0013264e;
  }
LAB_00133a8e:
  if (local_108 != (REF_GLOB *)0x0) {
    free(local_108);
  }
  iVar8 = ref_grid->mpi->id;
joined_r0x00133aa7:
  if (iVar8 != 0) {
    return 0;
  }
LAB_00133aac:
  fclose(pFVar12);
  return 0;
LAB_00134b8a:
  uVar21 = 0x86c;
LAB_00134532:
  printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",uVar21,
         "ref_gather_geom","id",1,sVar11);
LAB_00134539:
  uVar9 = 1;
  goto LAB_00134c91;
code_r0x001336ea:
  iVar8 = local_178->id;
  if (iVar8 == 0) {
LAB_001336ff:
    if (1 < local_178->n) {
      iVar8 = 1;
      do {
        uVar9 = ref_mpi_gather_recv(local_178,&local_168,1,1,iVar8);
        if (uVar9 != 0) {
          pcVar27 = "recv ngeom";
          uVar21 = 0x873;
          goto LAB_00134c87;
        }
        iVar23 = (int)local_168;
        if (0 < (int)local_168) {
          iVar18 = (int)local_168 * 3;
          local_158 = malloc((local_168 & 0xffffffff) * 0x18);
          if (local_158 == (void *)0x0) {
            pcVar27 = "malloc node_id of REF_GLOB NULL";
            uVar21 = 0x875;
            goto LAB_00134c2e;
          }
          local_a8 = malloc((ulong)(uint)(iVar23 * 2) << 3);
          if (local_a8 == (void *)0x0) {
            pcVar27 = "malloc param of REF_DBL NULL";
            uVar21 = 0x876;
            goto LAB_00134c2e;
          }
          uVar9 = ref_mpi_gather_recv(local_178,local_158,iVar18,2,iVar8);
          if (uVar9 != 0) {
            pcVar27 = "recv node_id";
            uVar21 = 0x879;
            goto LAB_00134c87;
          }
          uVar9 = ref_mpi_gather_recv(local_178,local_a8,(int)local_168 * 2,3,iVar8);
          if (uVar9 != 0) {
            pcVar27 = "recv param";
            uVar21 = 0x87b;
            goto LAB_00134c87;
          }
          if (0 < (int)local_168) {
            local_78 = local_a8;
            lVar28 = 0;
            do {
              uVar21 = *(undefined8 *)((long)local_158 + lVar28 * 0x18 + 8);
              local_d8[0] = (REF_DBL *)(double)*(long *)((long)local_158 + lVar28 * 0x18 + 0x10);
              RVar10 = ref_gather_meshb_glob
                                 ((FILE *)local_188,local_180,
                                  *(long *)((long)local_158 + lVar28 * 0x18) + 1);
              if (RVar10 != 0) {
                pcVar27 = "node";
                uVar21 = 0x880;
                goto LAB_00134aef;
              }
              uVar9 = ref_gather_meshb_int((FILE *)local_188,local_180,(REF_INT)uVar21);
              if (uVar9 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                       ,0x881,"ref_gather_geom",(ulong)uVar9,"id");
                goto LAB_00134539;
              }
              uVar25 = uVar30;
              pvVar15 = local_78;
              if (uVar30 != 0) {
                do {
                  sVar11 = fwrite(pvVar15,8,1,local_188);
                  if (sVar11 != 1) {
                    uVar21 = 0x884;
                    goto LAB_00134532;
                  }
                  pvVar15 = (void *)((long)pvVar15 + 8);
                  uVar25 = uVar25 - 1;
                } while (uVar25 != 0);
                sVar11 = fwrite(local_d8,8,1,local_188);
                if (sVar11 != 1) {
                  uVar21 = 0x886;
                  goto LAB_00134532;
                }
              }
              lVar28 = lVar28 + 1;
              local_78 = (void *)((long)local_78 + 0x10);
            } while (lVar28 < (int)local_168);
          }
          free(local_a8);
          free(local_158);
        }
        iVar8 = iVar8 + 1;
        pRVar26 = local_150;
      } while (iVar8 < local_178->n);
    }
LAB_00133572:
    if ((ref_grid->mpi->id == 0) && (sVar13 = ftell(local_188), local_130 != sVar13)) {
      pcVar27 = "geom inconsistent";
      uVar21 = 0x924;
      sVar11 = local_130;
      goto LAB_00134399;
    }
LAB_00133593:
    pFVar12 = local_188;
    uVar30 = uVar30 + 1;
    if (uVar30 == 3) goto LAB_00134676;
    goto LAB_00133255;
  }
LAB_00133355:
  local_168 = local_168 & 0xffffffff00000000;
  if (0 < (int)uVar9) {
    lVar28 = 0;
    iVar23 = 0;
    do {
      if ((uVar30 == *(uint *)((long)pRVar26->descr + lVar28)) &&
         (iVar8 == pRVar3->part[*(int *)((long)pRVar26->descr + lVar28 + 0x14)])) {
        iVar23 = iVar23 + 1;
        local_168 = CONCAT44(local_168._4_4_,iVar23);
      }
      lVar28 = lVar28 + 0x18;
    } while ((ulong)uVar9 * 0x18 != lVar28);
  }
  uVar9 = ref_mpi_gather_send(local_178,&local_168,1,1);
  if (uVar9 == 0) {
    iVar8 = (int)local_168;
    if ((int)local_168 < 1) goto LAB_00133572;
    pvVar15 = malloc((local_168 & 0xffffffff) * 0x18);
    if (pvVar15 == (void *)0x0) {
      pcVar27 = "malloc node_id of REF_GLOB NULL";
      uVar21 = 0x896;
    }
    else {
      pvVar16 = malloc((ulong)(uint)(iVar8 * 2) * 8);
      if (pvVar16 != (void *)0x0) {
        iVar23 = 0;
        local_158 = pvVar16;
        memset(pvVar16,0,(ulong)(iVar8 * 2 - 2) * 8 + 0x10);
        ref_mpi = local_178;
        local_168 = local_168 & 0xffffffff00000000;
        iVar8 = pRVar26->max;
        if (0 < (long)iVar8) {
          pRVar5 = pRVar26->descr;
          lVar28 = 0;
          lVar14 = 0;
          iVar23 = 0;
          do {
            if (uVar30 == (uint)pRVar5[lVar14 * 6]) {
              iVar18 = pRVar5[lVar14 * 6 + 5];
              if (local_178->id == pRVar3->part[iVar18]) {
                lVar29 = -1;
                if (((-1 < iVar18) && (iVar18 < pRVar3->max)) &&
                   (lVar29 = pRVar3->global[iVar18], lVar29 < 0)) {
                  lVar29 = -1;
                }
                lVar24 = (long)(iVar23 * 3);
                *(long *)((long)pvVar15 + lVar24 * 8) = lVar29;
                *(long *)((long)pvVar15 + lVar24 * 8 + 8) = (long)pRVar5[lVar14 * 6 + 1];
                *(long *)((long)pvVar15 + lVar24 * 8 + 0x10) = (long)pRVar5[lVar14 * 6 + 2];
                if (uVar30 != 0) {
                  pRVar6 = pRVar26->param;
                  uVar25 = 0;
                  do {
                    *(undefined8 *)((long)local_158 + uVar25 * 8 + (long)(iVar23 * 2) * 8) =
                         *(undefined8 *)((long)pRVar6 + uVar25 * 8 + lVar28);
                    uVar25 = uVar25 + 1;
                  } while (uVar30 != uVar25);
                }
                iVar23 = iVar23 + 1;
                local_168 = CONCAT44(local_168._4_4_,iVar23);
              }
            }
            lVar14 = lVar14 + 1;
            lVar28 = lVar28 + 0x10;
          } while (lVar14 != iVar8);
          iVar23 = iVar23 * 3;
        }
        uVar9 = ref_mpi_gather_send(local_178,pvVar15,iVar23,2);
        pvVar16 = local_158;
        if (uVar9 == 0) {
          uVar9 = ref_mpi_gather_send(ref_mpi,local_158,(int)local_168 * 2,3);
          if (uVar9 == 0) {
            free(pvVar16);
            free(pvVar15);
            goto LAB_00133572;
          }
          pcVar27 = "send param";
          uVar21 = 0x8a8;
        }
        else {
          pcVar27 = "send node_id";
          uVar21 = 0x8a6;
        }
        goto LAB_00134c87;
      }
      pcVar27 = "malloc param of REF_DBL NULL";
      uVar21 = 0x897;
    }
LAB_00134c2e:
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",uVar21
           ,"ref_gather_geom",pcVar27);
    uVar9 = 2;
  }
  else {
    pcVar27 = "send ngeom";
    uVar21 = 0x894;
LAB_00134c87:
    uVar30 = (ulong)uVar9;
LAB_00134c8a:
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",uVar21
           ,"ref_gather_geom",uVar30,pcVar27);
  }
LAB_00134c91:
  pcVar27 = "nodes";
  uVar21 = 0x922;
  goto LAB_00132951;
LAB_00134676:
  if (ref_grid->mpi->id != 0) {
    return 0;
  }
  RVar7 = local_150->cad_data_size;
  if (RVar7 == 0) {
LAB_00134e71:
    local_170[0] = 0x36;
    sVar13 = fwrite(local_170,4,1,local_188);
    if (sVar13 != 1) {
      pcVar27 = "vertex version code";
      uVar21 = 0x939;
      sVar11 = 1;
LAB_00134399:
      printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
             uVar21,"ref_gather_meshb",pcVar27,sVar11,sVar13);
      goto LAB_001343a0;
    }
    uVar9 = ref_export_meshb_next_position((FILE *)local_188,local_180,0);
    pFVar12 = local_188;
    if (uVar9 == 0) goto LAB_00133aac;
    pcVar27 = "next p";
    uVar21 = 0x93b;
LAB_00132951:
    uVar30 = (ulong)uVar9;
LAB_00132954:
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",uVar21
           ,"ref_gather_meshb",uVar30,pcVar27);
  }
  else {
    local_170[0] = 0x7e;
    lVar28 = ftell(local_188);
    sVar13 = fwrite(local_170,4,1,pFVar12);
    if (sVar13 != 1) {
      pcVar27 = "keyword";
      uVar21 = 0x92c;
      sVar11 = 1;
      goto LAB_00134399;
    }
    next_position = RVar7 + local_118 + lVar28;
    uVar9 = ref_export_meshb_next_position((FILE *)local_188,local_180,next_position);
    if (uVar9 != 0) {
      pcVar27 = "next p";
      uVar21 = 0x92d;
      goto LAB_00132951;
    }
    uVar9 = ref_gather_meshb_size((FILE *)local_188,local_180,local_150->cad_data_size);
    if (uVar9 == 0) {
      sVar11 = local_150->cad_data_size;
      sVar13 = fwrite(local_150->cad_data,1,sVar11,local_188);
      if (sVar11 == sVar13) {
        sVar13 = ftell(local_188);
        if (next_position == sVar13) {
          if (ref_grid->mpi->id != 0) {
            return 0;
          }
          goto LAB_00134e71;
        }
        pcVar27 = "cad_model inconsistent";
        uVar21 = 0x934;
        sVar11 = next_position;
      }
      else {
        pcVar27 = "node";
        uVar21 = 0x933;
      }
      goto LAB_00134399;
    }
    pcVar27 = "cad size";
    uVar21 = 0x92f;
LAB_00134da7:
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",uVar21
           ,"ref_gather_meshb",(ulong)uVar9,pcVar27);
LAB_001343a0:
    uVar9 = 1;
  }
LAB_0013295b:
  pcVar27 = "meshb failed";
  uVar21 = 0xb9d;
  goto LAB_00132679;
}

Assistant:

REF_FCN REF_STATUS ref_gather_by_extension(REF_GRID ref_grid,
                                           const char *filename) {
  size_t end_of_string;

  end_of_string = strlen(filename);

  if (end_of_string > 4 && (strcmp(&filename[end_of_string - 4], ".tec") == 0 ||
                            strcmp(&filename[end_of_string - 4], ".dat") == 0 ||
                            strcmp(&filename[end_of_string - 2], ".t") == 0)) {
    RSS(ref_gather_tec(ref_grid, filename), "scalar tec");
    return REF_SUCCESS;
  }
  if (end_of_string > 4 &&
      (strcmp(&filename[end_of_string - 4], ".avm") == 0)) {
    RSS(ref_gather_avm(ref_grid, filename), "scalar plt");
    return REF_SUCCESS;
  }
  if (end_of_string > 4 &&
      (strcmp(&filename[end_of_string - 4], ".plt") == 0)) {
    RSS(ref_gather_scalar_by_extension(ref_grid, 0, NULL, NULL, filename),
        "scalar plt");
    return REF_SUCCESS;
  }
  if (end_of_string > 10 &&
      strcmp(&filename[end_of_string - 10], ".lb8.ugrid") == 0) {
    RSS(ref_gather_bin_ugrid(ref_grid, filename, REF_FALSE, REF_FALSE),
        ".lb8.ugrid failed");
    return REF_SUCCESS;
  }
  if (end_of_string > 9 &&
      strcmp(&filename[end_of_string - 9], ".b8.ugrid") == 0) {
    RSS(ref_gather_bin_ugrid(ref_grid, filename, REF_TRUE, REF_FALSE),
        ".b8.ugrid failed");
    return REF_SUCCESS;
  }
  if (end_of_string > 11 &&
      strcmp(&filename[end_of_string - 11], ".lb8l.ugrid") == 0) {
    RSS(ref_gather_bin_ugrid(ref_grid, filename, REF_FALSE, REF_TRUE),
        ".lb8l.ugrid failed");
    return REF_SUCCESS;
  }
  if (end_of_string > 10 &&
      strcmp(&filename[end_of_string - 10], ".b8l.ugrid") == 0) {
    RSS(ref_gather_bin_ugrid(ref_grid, filename, REF_TRUE, REF_TRUE),
        ".b8l.ugrid failed");
    return REF_SUCCESS;
  }
  if (end_of_string > 12 &&
      strcmp(&filename[end_of_string - 12], ".lb8.ugrid64") == 0) {
    RSS(ref_gather_bin_ugrid(ref_grid, filename, REF_FALSE, REF_TRUE),
        ".lb8.ugrid64 failed");
    return REF_SUCCESS;
  }
  if (end_of_string > 11 &&
      strcmp(&filename[end_of_string - 11], ".b8.ugrid64") == 0) {
    RSS(ref_gather_bin_ugrid(ref_grid, filename, REF_TRUE, REF_TRUE),
        ".b8.ugrid64 failed");
    return REF_SUCCESS;
  }
  if (end_of_string > 6 &&
      strcmp(&filename[end_of_string - 6], ".meshb") == 0) {
    RSS(ref_gather_meshb(ref_grid, filename), "meshb failed");
    return REF_SUCCESS;
  }
  printf("%s: %d: %s %s\n", __FILE__, __LINE__,
         "output file name extension unknown", filename);
  return REF_FAILURE;
}